

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::RemoveUnreliableCandidates
               (int f0_length,int number_of_candidates,double **f0_candidates,double **f0_scores)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double **f0_scores_00;
  double *pdVar4;
  double **in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int i_3;
  int j_1;
  int i_2;
  int j;
  int i_1;
  int i;
  double **tmp_f0_candidates;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDI;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  f0_scores_00 = (double **)operator_new__(uVar3);
  for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)in_ESI;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pdVar4 = (double *)operator_new__(uVar3);
    f0_scores_00[local_24] = pdVar4;
  }
  for (local_28 = 0; local_28 < in_EDI; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < in_ESI; local_2c = local_2c + 1) {
      f0_scores_00[local_28][local_2c] =
           *(double *)(*(long *)(in_RDX + (long)local_28 * 8) + (long)local_2c * 8);
    }
  }
  for (local_30 = 1; local_30 < in_EDI + -1; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
      RemoveUnreliableCandidatesSub
                (unaff_retaddr_00,unaff_retaddr,(double **)CONCAT44(in_EDI,in_ESI),
                 (int)((ulong)in_RDX >> 0x20),in_RCX,f0_scores_00);
    }
  }
  for (local_38 = 0; local_38 < in_EDI; local_38 = local_38 + 1) {
    if (f0_scores_00[local_38] != (double *)0x0) {
      operator_delete__(f0_scores_00[local_38]);
    }
  }
  if (f0_scores_00 != (double **)0x0) {
    operator_delete__(f0_scores_00);
  }
  return;
}

Assistant:

static void RemoveUnreliableCandidates(int f0_length, int number_of_candidates,
    double **f0_candidates, double **f0_scores) {
  double **tmp_f0_candidates = new double *[f0_length];
  for (int i = 0; i < f0_length; ++i)
    tmp_f0_candidates[i] = new double[number_of_candidates];
  for (int i = 0; i < f0_length; ++i)
    for (int j = 0; j < number_of_candidates; ++j)
      tmp_f0_candidates[i][j] = f0_candidates[i][j];

  for (int i = 1; i < f0_length - 1; ++i)
    for (int j = 0; j < number_of_candidates; ++j)
      RemoveUnreliableCandidatesSub(i, j, tmp_f0_candidates,
          number_of_candidates, f0_candidates, f0_scores);

  for (int i = 0; i < f0_length; ++i) delete[] tmp_f0_candidates[i];
  delete[] tmp_f0_candidates;
}